

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

QString * __thiscall QMakeLocalFileName::local(QMakeLocalFileName *this)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  QString *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isNull((QMakeLocalFileName *)0x1cf5ca);
  if ((!bVar2) && (bVar2 = QString::isNull((QString *)0x1cf5dc), bVar2)) {
    Option::normalizePath
              (in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7,
               (bool)in_stack_ffffffffffffffe6);
    QString::operator=(in_RDI,in_stack_ffffffffffffffc8);
    QString::~QString((QString *)0x1cf615);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI + 1;
}

Assistant:

const QString
&QMakeLocalFileName::local() const
{
    if (!isNull() && local_name.isNull())
        local_name = Option::normalizePath(real_name);
    return local_name;
}